

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposer.h
# Opt level: O2

Link __thiscall FixedDegreeProposer::random_old_link(FixedDegreeProposer *this,Network *network)

{
  pointer psVar1;
  size_t sVar2;
  uint uVar3;
  Link LVar4;
  const_iterator it;
  
  LVar4.first = Random::R(this->rng,0,
                          (uint)((ulong)((long)(network->node_list).
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(network->node_list).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 2));
  psVar1 = (network->links).
           super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar2 = *(size_t *)((long)&psVar1[LVar4.first]._M_t._M_impl.super__Rb_tree_header + 0x20);
  if (sVar2 != 0) {
    uVar3 = Random::R(this->rng,0,(uint)sVar2);
    it._M_node = *(_Base_ptr *)
                  ((long)&psVar1[LVar4.first]._M_t._M_impl.super__Rb_tree_header + 0x10);
    std::__advance<std::_Rb_tree_const_iterator<unsigned_int>,long>(&it,uVar3);
    LVar4.second = it._M_node[1]._M_color;
    return LVar4;
  }
  __assert_fail("list.size() != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SamplingConstrainedNetworks[P]code/source/proposer.h"
                ,0x25,"Link FixedDegreeProposer::random_old_link(const Network &) const");
}

Assistant:

Link random_old_link(Network const& network) const {
        Link link;

        link.first = rng.R(0, network.getN());

        std::set<unsigned int> const& list = network.get_links(link.first);
        assert(list.size() != 0);

        // generates a random neighberhood, link.second, of link.first
        unsigned int index_j = rng.R(0, list.size());
        std::set<unsigned int>::const_iterator it = list.begin();
        std::advance(it, index_j);
        link.second = *it;

        return link;
    }